

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O1

void Ssw_ManSweepLatchOne(Ssw_Man_t *p,Aig_Obj_t *pObjRepr,Aig_Obj_t *pObj)

{
  Aig_Man_t *pAVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  Aig_Obj_t *pNew;
  Aig_Obj_t *pCand;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pOld;
  uint uVar10;
  timespec ts;
  timespec local_40;
  
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                  ,0xa5,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  uVar3 = (uint)*(undefined8 *)&pObjRepr->field_0x18 & 7;
  if (uVar3 != 2) {
    if (((ulong)pObjRepr & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar3 != 1) {
      __assert_fail("Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                    ,0xa6,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  if (((100 < p->nCallsCount) && (p->nCallsUnsat < p->nCallsSat)) &&
     (iVar4 = p->nCallsDelta, p->nCallsDelta = iVar4 + 1, iVar4 < -1)) {
    return;
  }
  p->nCallsDelta = 0;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    pAVar1 = p->pAig;
    if (pAVar1->nTruePis <= (pObj->field_0).CioId) {
      uVar3 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
      if (((int)uVar3 < 0) || (pAVar1->vCos->nSize <= (int)uVar3)) {
LAB_006155c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAVar1->vCos->pArray[uVar3];
      Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006155fe:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                      ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      uVar5 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                (ulong)p->pNodeToFrames[(long)*(int *)(uVar5 + 0x24) * (long)p->nFrames];
      }
      if ((*(uint *)&pObjRepr->field_0x18 & 7) == 2) {
        pAVar1 = p->pAig;
        if ((pObjRepr->field_0).CioId < pAVar1->nTruePis) goto LAB_006155df;
        uVar3 = ((pObjRepr->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
        if (((int)uVar3 < 0) || (pAVar1->vCos->nSize <= (int)uVar3)) goto LAB_006155c0;
        pvVar2 = pAVar1->vCos->pArray[uVar3];
        Ssw_ManBuildCone_rec(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006155fe;
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                   (ulong)p->pNodeToFrames[(long)*(int *)(uVar6 + 0x24) * (long)p->nFrames]);
        }
      }
      else {
        pAVar9 = p->pNodeToFrames[(long)pObjRepr->Id * (long)p->nFrames];
      }
      iVar4 = clock_gettime(3,&local_40);
      if (iVar4 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeReduce = p->timeReduce + lVar8 + lVar7;
      pNew = (Aig_Obj_t *)(uVar5 & 0xfffffffffffffffe);
      pOld = (Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe);
      if (pNew == pOld) {
        return;
      }
      p->nRecycleCalls = p->nRecycleCalls + 1;
      p->nCallsCount = p->nCallsCount + 1;
      uVar3 = 1;
      uVar10 = 1;
      if (uVar5 != 0) {
        uVar10 = ((uint)uVar5 ^ *(uint *)&pNew->field_0x18 >> 3) & 1;
      }
      if (pAVar9 != (Aig_Obj_t *)0x0) {
        uVar3 = ((uint)pAVar9 ^ *(uint *)&pOld->field_0x18 >> 3) & 1;
      }
      if ((uVar10 != uVar3) ==
          (((*(ulong *)&pObjRepr->field_0x18 ^ *(ulong *)&pObj->field_0x18) & 8) == 0)) {
        p->nPatterns = p->nPatterns + 1;
        p->nStrangers = p->nStrangers + 1;
      }
      else {
        iVar4 = Ssw_NodesAreEquiv(p,pOld,pNew);
        if (iVar4 == -1) {
          Ssw_ClassesRemoveNode(p->ppClasses,pObj);
          p->nCallsUnsat = p->nCallsUnsat + 1;
        }
        else {
          if (iVar4 == 1) {
            p->nCallsUnsat = p->nCallsUnsat + 1;
            return;
          }
          Ssw_SmlAddPattern(p,pOld,pCand);
          p->nPatterns = p->nPatterns + 1;
          p->nCallsSat = p->nCallsSat + 1;
        }
      }
      p->fRefined = 1;
      return;
    }
  }
LAB_006155df:
  __assert_fail("Saig_ObjIsLo(p, pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_ManSweepLatchOne( Ssw_Man_t * p, Aig_Obj_t * pObjRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFraig, * pObjReprFraig, * pObjLi;
    int RetValue;
    abctime clk;
    assert( Aig_ObjIsCi(pObj) );
    assert( Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr) );
    // check if it makes sense to skip some calls
    if ( p->nCallsCount > 100 && p->nCallsUnsat < p->nCallsSat )
    {
        if ( ++p->nCallsDelta < 0 )
            return;
    }
    p->nCallsDelta = 0;
clk = Abc_Clock();
    // get the fraiged node
    pObjLi = Saig_ObjLoToLi( p->pAig, pObj );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
    pObjFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    // get the fraiged representative
    if ( Aig_ObjIsCi(pObjRepr) )
    {
        pObjLi = Saig_ObjLoToLi( p->pAig, pObjRepr );
        Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
        pObjReprFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    }
    else
        pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, 0 );
p->timeReduce += Abc_Clock() - clk;
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return;
    p->nRecycleCalls++;
    p->nCallsCount++;

    // check equivalence of the two nodes
    if ( (pObj->fPhase == pObjRepr->fPhase) != (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) )
    {
        p->nPatterns++;
        p->nStrangers++;
        p->fRefined = 1;
    }
    else
    {
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        if ( RetValue == 1 )  // proved equivalence
        {
            p->nCallsUnsat++;
            return;
        }
        if ( RetValue == -1 ) // timed out
        {
            Ssw_ClassesRemoveNode( p->ppClasses, pObj );
            p->nCallsUnsat++;
            p->fRefined = 1;
            return;
        }
        else // disproved equivalence
        {
            Ssw_SmlAddPattern( p, pObjRepr, pObj );
            p->nPatterns++;
            p->nCallsSat++;
            p->fRefined = 1;
        }
    }
}